

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Chapter::Clear(Chapter *this)

{
  Display *pDVar1;
  uint uVar2;
  
  anon_unknown_12::StrCpy((char *)0x0,&this->id_);
  while( true ) {
    pDVar1 = this->displays_;
    if (this->displays_count_ < 1) break;
    uVar2 = this->displays_count_ - 1;
    this->displays_count_ = uVar2;
    Display::Clear(pDVar1 + uVar2);
  }
  if (pDVar1 != (Display *)0x0) {
    operator_delete__(pDVar1);
  }
  this->displays_ = (Display *)0x0;
  this->displays_size_ = 0;
  return;
}

Assistant:

void Chapter::Clear() {
  StrCpy(NULL, &id_);

  while (displays_count_ > 0) {
    Display& d = displays_[--displays_count_];
    d.Clear();
  }

  delete[] displays_;
  displays_ = NULL;

  displays_size_ = 0;
}